

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::parse_true
          (basic_json_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  size_t sVar1;
  char_type *pcVar2;
  
  sVar1 = this->position_;
  this->begin_position_ = sVar1;
  pcVar2 = this->input_ptr_;
  if ((long)this->end_input_ - (long)pcVar2 < 4) {
    this->input_ptr_ = pcVar2 + 1;
    this->position_ = sVar1 + 1;
    this->state_ = t;
  }
  else if (((pcVar2[1] == 'r') && (pcVar2[2] == 'u')) && (pcVar2[3] == 'e')) {
    this->input_ptr_ = pcVar2 + 4;
    this->position_ = sVar1 + 4;
    (*visitor->_vptr_basic_json_visitor[0xb])(visitor,1,0,this,ec);
    this->state_ = (this->level_ != 0) * '\x05' + accept;
    this->more_ = (bool)(this->cursor_mode_ ^ 1);
  }
  else {
    std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::operator()
              (&this->err_handler_,invalid_value,&this->super_ser_context);
    std::error_code::operator=(ec,invalid_value);
    this->more_ = false;
  }
  return;
}

Assistant:

void parse_true(basic_json_visitor<char_type>& visitor, std::error_code& ec)
    {
        begin_position_ = position_;
        if (JSONCONS_LIKELY(end_input_ - input_ptr_ >= 4))
        {
            if (*(input_ptr_+1) == 'r' && *(input_ptr_+2) == 'u' && *(input_ptr_+3) == 'e')
            {
                input_ptr_ += 4;
                position_ += 4;
                visitor.bool_value(true, semantic_tag::none, *this, ec);
                if (level_ == 0)
                {
                    state_ = parse_state::accept;
                }
                else
                {
                    state_ = parse_state::expect_comma_or_end;
                }
                more_ = !cursor_mode_;
            }
            else
            {
                err_handler_(json_errc::invalid_value, *this);
                ec = json_errc::invalid_value;
                more_ = false;
                return;
            }
        }
        else
        {
            ++input_ptr_;
            ++position_;
            state_ = parse_state::t;
        }
    }